

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<std::__cxx11::string,std::allocator>::push<std::__cxx11::string_const&>
          (stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar1;
  error *this_01;
  string *in_RSI;
  stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
  *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  bVar1 = stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
          ::full(in_RDI);
  if (!bVar1) {
    this_00 = in_RDI->m_current;
    in_RDI->m_current = this_00 + 1;
    std::__cxx11::string::string((string *)this_00,local_10);
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"E000I",&local_31);
  cov::error::error(this_01,in_stack_ffffffffffffff98);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}